

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O0

int CVodeSetDeltaGammaMaxLSetup(void *cvode_mem,realtype dgmax_lsetup)

{
  long in_RDI;
  double in_XMM0_Qa;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == 0) {
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeSetDeltaGammaMaxLSetup",
                   "cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    if (0.0 <= in_XMM0_Qa) {
      *(double *)(in_RDI + 0x418) = in_XMM0_Qa;
    }
    else {
      *(undefined8 *)(in_RDI + 0x418) = 0x3fd3333333333333;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeSetDeltaGammaMaxLSetup(void *cvode_mem, realtype dgmax_lsetup)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeSetDeltaGammaMaxLSetup",
                   MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  /* Set value or use default */
  if(dgmax_lsetup < ZERO)
    cv_mem->cv_dgmax_lsetup = DGMAX_LSETUP_DEFAULT;
  else
    cv_mem->cv_dgmax_lsetup = dgmax_lsetup;

  return(CV_SUCCESS);
}